

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

string * tonk::HexString_abi_cxx11_(uint64_t value)

{
  char *pcVar1;
  ulong in_RSI;
  string *in_RDI;
  uint i;
  char *hexWrite;
  char hex [17];
  allocator local_45 [16];
  allocator local_35;
  uint local_34;
  char *local_30;
  char local_28 [14];
  char local_1a [10];
  ulong local_10;
  
  local_1a[2] = 0;
  local_30 = local_1a;
  local_34 = 0;
  local_10 = in_RSI;
  while( true ) {
    pcVar1 = local_30;
    if (7 < local_34) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,local_28,local_45);
      std::allocator<char>::~allocator((allocator<char> *)local_45);
      return in_RDI;
    }
    local_30[1] = HexString::H[local_10 & 0xf];
    *local_30 = HexString::H[local_10 >> 4 & 0xf];
    local_10 = local_10 >> 8;
    if (local_10 == 0) break;
    local_30 = local_30 + -2;
    local_34 = local_34 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,&local_35);
  std::allocator<char>::~allocator((allocator<char> *)&local_35);
  return in_RDI;
}

Assistant:

std::string HexString(uint64_t value)
{
    static const char* H = "0123456789abcdef";

    char hex[16 + 1];
    hex[16] = '\0';

    char* hexWrite = &hex[14];
    for (unsigned i = 0; i < 8; ++i)
    {
        hexWrite[1] = H[value & 15];
        hexWrite[0] = H[(value >> 4) & 15];

        value >>= 8;
        if (value == 0)
            return hexWrite;
        hexWrite -= 2;
    }

    return hex;
}